

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMAttrImpl.cpp
# Opt level: O0

void __thiscall xercesc_4_0::DOMAttrImpl::release(DOMAttrImpl *this)

{
  DOMDocument *pDVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  DOMException *pDVar4;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  MemoryManager *local_c0;
  DOMDocumentImpl *local_b0;
  long local_a0;
  MemoryManager *local_90;
  DOMNode *local_80;
  MemoryManager *local_70;
  DOMDocumentImpl *local_60;
  long local_50;
  MemoryManager *local_40;
  DOMDocumentImpl *doc;
  DOMAttrImpl *this_local;
  
  bVar2 = DOMNodeImpl::isOwned(&this->fNode);
  if ((bVar2) && (bVar2 = DOMNodeImpl::isToBeReleased(&this->fNode), !bVar2)) {
    pDVar4 = (DOMException *)__cxa_allocate_exception(0x28);
    if (this == (DOMAttrImpl *)0x0) {
      local_40 = XMLPlatformUtils::fgMemoryManager;
    }
    else {
      iVar3 = (*(this->super_DOMAttr).super_DOMNode._vptr_DOMNode[0xc])();
      if (CONCAT44(extraout_var,iVar3) == 0) {
        local_50 = 0;
      }
      else {
        local_50 = CONCAT44(extraout_var,iVar3) + -8;
      }
      if (local_50 == 0) {
        local_70 = XMLPlatformUtils::fgMemoryManager;
      }
      else {
        iVar3 = (*(this->super_DOMAttr).super_DOMNode._vptr_DOMNode[0xc])();
        if (CONCAT44(extraout_var_00,iVar3) == 0) {
          local_60 = (DOMDocumentImpl *)0x0;
        }
        else {
          local_60 = (DOMDocumentImpl *)(CONCAT44(extraout_var_00,iVar3) + -8);
        }
        local_70 = DOMDocumentImpl::getMemoryManager(local_60);
      }
      local_40 = local_70;
    }
    DOMException::DOMException(pDVar4,0xf,0,local_40);
    __cxa_throw(pDVar4,&DOMException::typeinfo,DOMException::~DOMException);
  }
  pDVar1 = (this->fParent).fOwnerDocument;
  if (pDVar1 == (DOMDocument *)0x0) {
    local_80 = (DOMNode *)0x0;
  }
  else {
    local_80 = &pDVar1[-1].super_DOMNode;
  }
  if (local_80 == (DOMNode *)0x0) {
    pDVar4 = (DOMException *)__cxa_allocate_exception(0x28);
    if (this == (DOMAttrImpl *)0x0) {
      local_90 = XMLPlatformUtils::fgMemoryManager;
    }
    else {
      iVar3 = (*(this->super_DOMAttr).super_DOMNode._vptr_DOMNode[0xc])();
      if (CONCAT44(extraout_var_01,iVar3) == 0) {
        local_a0 = 0;
      }
      else {
        local_a0 = CONCAT44(extraout_var_01,iVar3) + -8;
      }
      if (local_a0 == 0) {
        local_c0 = XMLPlatformUtils::fgMemoryManager;
      }
      else {
        iVar3 = (*(this->super_DOMAttr).super_DOMNode._vptr_DOMNode[0xc])();
        if (CONCAT44(extraout_var_02,iVar3) == 0) {
          local_b0 = (DOMDocumentImpl *)0x0;
        }
        else {
          local_b0 = (DOMDocumentImpl *)(CONCAT44(extraout_var_02,iVar3) + -8);
        }
        local_c0 = DOMDocumentImpl::getMemoryManager(local_b0);
      }
      local_90 = local_c0;
    }
    DOMException::DOMException(pDVar4,0xf,0,local_90);
    __cxa_throw(pDVar4,&DOMException::typeinfo,DOMException::~DOMException);
  }
  DOMNodeImpl::callUserDataHandlers(&this->fNode,NODE_DELETED,(DOMNode *)0x0,(DOMNode *)0x0);
  DOMParentNode::release(&this->fParent);
  (*local_80->_vptr_DOMNode[6])(local_80,this,0);
  return;
}

Assistant:

void DOMAttrImpl::release()
{
    if (fNode.isOwned() && !fNode.isToBeReleased())
        throw DOMException(DOMException::INVALID_ACCESS_ERR,0, GetDOMNodeMemoryManager);

    DOMDocumentImpl* doc = (DOMDocumentImpl*)fParent.fOwnerDocument;
    if (doc) {
        fNode.callUserDataHandlers(DOMUserDataHandler::NODE_DELETED, 0, 0);
        fParent.release();
        doc->release(this, DOMMemoryManager::ATTR_OBJECT);
    }
    else {
        // shouldn't reach here
        throw DOMException(DOMException::INVALID_ACCESS_ERR,0, GetDOMNodeMemoryManager);
    }
}